

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try_signal.cpp
# Opt level: O0

void sig::detail::handler(int signo,siginfo_t *param_2,void *param_3)

{
  long lVar1;
  void *param_2_local;
  siginfo_t *param_1_local;
  int signo_local;
  
  lVar1 = __tls_get_addr(&PTR_00b96fc0);
  if (*(long *)(lVar1 + 0x13b8) != 0) {
    lVar1 = __tls_get_addr(&PTR_00b96fc0);
    siglongjmp(*(__jmp_buf_tag **)(lVar1 + 0x13b8),signo);
  }
  signal(signo,(__sighandler_t)0x0);
  raise(signo);
  return;
}

Assistant:

void handler(int const signo, siginfo_t*, void*)
{
	std::atomic_signal_fence(std::memory_order_acquire);
	if (jmpbuf)
		siglongjmp(*jmpbuf, signo);

	// this signal was not caused within the scope of a try_signal object,
	// invoke the default handler
	signal(signo, SIG_DFL);
	raise(signo);
}